

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int source_set_outcomes(SOURCE_HANDLE source,AMQP_VALUE outcomes_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE outcomes_amqp_value;
  SOURCE_INSTANCE *source_instance;
  int result;
  AMQP_VALUE outcomes_value_local;
  SOURCE_HANDLE source_local;
  
  if (source == (SOURCE_HANDLE)0x0) {
    source_instance._4_4_ = 0x33d4;
  }
  else {
    if (outcomes_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(outcomes_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      source_instance._4_4_ = 0x33e4;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(source->composite_value,9,local_30);
      if (iVar1 == 0) {
        source_instance._4_4_ = 0;
      }
      else {
        source_instance._4_4_ = 0x33ea;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return source_instance._4_4_;
}

Assistant:

int source_set_outcomes(SOURCE_HANDLE source, AMQP_VALUE outcomes_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        AMQP_VALUE outcomes_amqp_value;
        if (outcomes_value == NULL)
        {
            outcomes_amqp_value = NULL;
        }
        else
        {
            outcomes_amqp_value = amqpvalue_clone(outcomes_value);
        }
        if (outcomes_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(source_instance->composite_value, 9, outcomes_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(outcomes_amqp_value);
        }
    }

    return result;
}